

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O2

void __thiscall QTzTimeZonePrivate::QTzTimeZonePrivate(QTzTimeZonePrivate *this,QByteArray *ianaId)

{
  qsizetype qVar1;
  Data *pDVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  qint64 atMSecsSinceEpoch;
  QTzTimeZonePrivate *this_00;
  long in_FS_OFFSET;
  QTzTimeZoneCacheEntry entry;
  QArrayDataPointer<char16_t> local_d0;
  QArrayDataPointer<char> local_b8;
  undefined1 local_98 [104];
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this;
  QTimeZonePrivate::QTimeZonePrivate(&this->super_QTimeZonePrivate);
  (this->super_QTimeZonePrivate)._vptr_QTimeZonePrivate =
       (_func_int **)&PTR__QTzTimeZonePrivate_0066a0d0;
  (this->cached_data).m_hasDst = false;
  (this->cached_data).m_tranTimes.d.d = (Data *)0x0;
  (this->cached_data).m_tranTimes.d.ptr = (QTzTransitionTime *)0x0;
  (this->cached_data).m_tranTimes.d.size = 0;
  (this->cached_data).m_tranRules.d.d = (Data *)0x0;
  (this->cached_data).m_tranRules.d.ptr = (QTzTransitionRule *)0x0;
  (this->cached_data).m_tranRules.d.size = 0;
  (this->cached_data).m_abbreviations.d.d = (Data *)0x0;
  (this->cached_data).m_abbreviations.d.ptr = (QByteArray *)0x0;
  (this->cached_data).m_abbreviations.d.size = 0;
  (this->cached_data).m_posixRule.d.d = (Data *)0x0;
  (this->cached_data).m_posixRule.d.ptr = (char *)0x0;
  (this->cached_data).m_posixRule.d.size = 0;
  *(undefined8 *)((long)&(this->cached_data).m_posixRule.d.size + 1) = 0;
  *(undefined8 *)((long)&(this->cached_data).m_preZoneRule.stdOffset + 1) = 0;
  bVar4 = isTimeZoneIdAvailable(this_00,ianaId);
  if (bVar4) {
    if (QTzTimeZonePrivate(QByteArray_const&)::tzCache == '\0') {
      iVar5 = __cxa_guard_acquire(&QTzTimeZonePrivate(QByteArray_const&)::tzCache);
      if (iVar5 != 0) {
        QTzTimeZoneCache::QTzTimeZoneCache(&QTzTimeZonePrivate::tzCache);
        __cxa_atexit(QTzTimeZoneCache::~QTzTimeZoneCache,&QTzTimeZonePrivate::tzCache,&__dso_handle)
        ;
        __cxa_guard_release(&QTzTimeZonePrivate(QByteArray_const&)::tzCache);
      }
    }
    local_98._96_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_98._80_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._88_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._56_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTzTimeZoneCache::fetchEntry
              ((QTzTimeZoneCacheEntry *)local_98,&QTzTimeZonePrivate::tzCache,ianaId);
    if (((undefined1 *)local_98._16_8_ != (undefined1 *)0x0) ||
       ((undefined1 *)local_98._88_8_ != (undefined1 *)0x0)) {
      QTzTimeZoneCacheEntry::operator=(&this->cached_data,(QTzTimeZoneCacheEntry *)local_98);
      QByteArray::operator=(&(this->super_QTimeZonePrivate).m_id,ianaId);
      if ((this->super_QTimeZonePrivate).m_id.d.size == 0) {
        atMSecsSinceEpoch = QDateTime::currentMSecsSinceEpoch();
        abbreviation((QString *)&local_d0,this,atMSecsSinceEpoch);
        QString::toUtf8_helper((QByteArray *)&local_b8,(QString *)&local_d0);
        pDVar2 = (this->super_QTimeZonePrivate).m_id.d.d;
        pcVar3 = (this->super_QTimeZonePrivate).m_id.d.ptr;
        (this->super_QTimeZonePrivate).m_id.d.d = local_b8.d;
        (this->super_QTimeZonePrivate).m_id.d.ptr = local_b8.ptr;
        qVar1 = (this->super_QTimeZonePrivate).m_id.d.size;
        (this->super_QTimeZonePrivate).m_id.d.size = local_b8.size;
        local_b8.d = pDVar2;
        local_b8.ptr = pcVar3;
        local_b8.size = qVar1;
        QArrayDataPointer<char>::~QArrayDataPointer(&local_b8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
      }
    }
    QTzTimeZoneCacheEntry::~QTzTimeZoneCacheEntry((QTzTimeZoneCacheEntry *)local_98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTzTimeZonePrivate::QTzTimeZonePrivate(const QByteArray &ianaId)
{
    if (!isTimeZoneIdAvailable(ianaId)) // Avoid pointlessly creating cache entries
        return;
    static QTzTimeZoneCache tzCache;
    auto entry = tzCache.fetchEntry(ianaId);
    if (entry.m_tranTimes.isEmpty() && entry.m_posixRule.isEmpty())
        return; // Invalid after all !

    cached_data = std::move(entry);
    m_id = ianaId;
    // Avoid empty ID, if we have an abbreviation to use instead
    if (m_id.isEmpty()) {
        // This can only happen for the system zone, when we've read the
        // contents of /etc/localtime because it wasn't a symlink.
        // TODO: use CLDR generic abbreviation for the zone.
        m_id = abbreviation(QDateTime::currentMSecsSinceEpoch()).toUtf8();
    }
}